

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
FPathTraverse::PortalRelocate(FPathTraverse *this,DVector2 *displacement,int flags,double hitfrac)

{
  double endy;
  double endx;
  double hity;
  double hitx;
  double hitfrac_local;
  int flags_local;
  DVector2 *displacement_local;
  FPathTraverse *this_local;
  
  TArray<intercept_t,_intercept_t>::Resize(&intercepts,this->intercept_index);
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)flags);
  return;
}

Assistant:

void FPathTraverse::PortalRelocate(const DVector2 &displacement, int flags, double hitfrac)
{
	double hitx = trace.x + displacement.X;
	double hity = trace.y + displacement.Y;
	double endx = hitx + trace.dx;
	double endy = hity + trace.dy;
	intercepts.Resize(intercept_index);
	init(hitx, hity, endx, endy, flags, hitfrac);
}